

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O1

void __thiscall
SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>::Clear
          (SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *this)

{
  Recycler *this_00;
  SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *pSVar1;
  SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *buffer;
  
  buffer = (SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *)
           (this->super_SListBase<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>).
           super_SListNodeBase<Memory::Recycler>.next.ptr;
  if (buffer != this) {
    this_00 = this->allocator;
    do {
      pSVar1 = (SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *)
               (buffer->super_SListBase<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>).
               super_SListNodeBase<Memory::Recycler>.next.ptr;
      Memory::Recycler::ExplicitFreeNonLeaf(this_00,buffer,0x10);
      buffer = pSVar1;
    } while (pSVar1 != this);
  }
  Memory::Recycler::WBSetBit((char *)this);
  (this->super_SListBase<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>).
  super_SListNodeBase<Memory::Recycler>.next.ptr = (SListNodeBase<Memory::Recycler> *)this;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  (this->super_SListBase<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>).super_RealCount.count =
       0;
  return;
}

Assistant:

void Clear()
    {
        __super::Clear(allocator);
    }